

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  anon_union_8_1_a8a14541_for_iterator_2 buffer;
  FieldDescriptor *field1;
  ushort *puVar1;
  ushort *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Context *pCVar8;
  bool bVar9;
  int iVar10;
  pointer ppFVar11;
  LogMessage *this_00;
  pointer ppFVar12;
  flat_hash_map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
  *this_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar13;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  FieldDescriptor *pFVar14;
  ulong uVar15;
  ulong uVar16;
  string *info_00;
  string_view name1;
  string_view name1_00;
  string_view str;
  string_view v;
  string_view str_00;
  string_view str_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view name2;
  string_view name2_00;
  difference_type __n;
  FieldDescriptor *field;
  FieldGeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  long local_1e0;
  undefined1 local_1c8 [48];
  FieldDescriptor *local_198;
  ulong local_190;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_188;
  undefined1 local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_140;
  char *local_138;
  FeatureSet *local_130;
  long local_128;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_120;
  char *local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined4 local_100;
  undefined2 local_fc;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined2 local_b8;
  Context *local_b0;
  long local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  FieldDescriptor *local_88;
  ulong local_80;
  vector<bool,_std::allocator<bool>_> local_78;
  string local_50;
  
  local_160._M_dataplus._M_p = local_160._M_dataplus._M_p & 0xffffffffffffff00;
  local_b0 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_160,
             (allocator_type *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_160);
  ppFVar12 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar11 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_188 = fields;
  if (ppFVar11 != ppFVar12) {
    uVar15 = 1;
    local_a8 = 0x20;
    pFVar13 = extraout_RDX;
    pFVar14 = (FieldDescriptor *)0x0;
    do {
      field1 = ppFVar12[(long)pFVar14];
      CapitalizedFieldName_abi_cxx11_((string *)local_1c8,(java *)field1,pFVar13);
      local_88 = (FieldDescriptor *)&pFVar14->field_0x1;
      ppFVar11 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pFVar13 = (FieldDescriptor *)
                ((long)(fields->
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3);
      local_190 = 1L << ((byte)pFVar14 & 0x3f);
      uVar16 = (ulong)pFVar14 >> 6;
      local_1e0 = local_a8;
      local_198 = pFVar14;
      local_80 = uVar15;
      if (local_88 < pFVar13) {
        do {
          pFVar14 = ppFVar11[uVar15];
          CapitalizedFieldName_abi_cxx11_((string *)local_180,(java *)pFVar14,pFVar13);
          uVar7 = local_180._8_8_;
          uVar6 = local_180._0_8_;
          uVar5 = local_1c8._8_8_;
          uVar4 = local_1c8._0_8_;
          if ((local_1c8._8_8_ == local_180._8_8_) &&
             (((slot_type *)local_1c8._8_8_ == (slot_type *)0x0 ||
              (iVar10 = bcmp((void *)local_1c8._0_8_,(void *)local_180._0_8_,local_1c8._8_8_),
              iVar10 == 0)))) {
            local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6 & 0x3ffffff] =
                 local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [uVar15 >> 6 & 0x3ffffff] | 1L << ((byte)uVar15 & 0x3f);
            local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar16] =
                 local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16] | local_190
            ;
            puVar1 = (ushort *)(field1->all_names_).payload_;
            local_160.field_2._M_allocated_capacity = (size_type)*puVar1;
            puVar2 = (ushort *)(pFVar14->all_names_).payload_;
            local_130 = (FeatureSet *)(ulong)*puVar2;
            local_160._M_dataplus._M_p = &DAT_0000001b;
            local_160._M_string_length = 0x1338fb2;
            pieces._M_len = (long)puVar1 + ~local_160.field_2._M_allocated_capacity;
            local_140 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x18;
            local_138 = "\" conflicts with field \"";
            local_128 = (long)puVar2 + ~(ulong)local_130;
            local_120.default_value_int64_t_ = 1;
            local_118 = "\"";
            pieces._M_array = (iterator)&DAT_00000005;
            local_160.field_2._8_8_ = pieces._M_len;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      (&local_50,(strings_internal *)&local_160,pieces);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&((local_a0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       local_1e0),(string *)&local_50);
            std::__cxx11::string::_M_assign
                      ((string *)
                       (local_a0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)local_198));
            pFVar13 = extraout_RDX_00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
              pFVar13 = extraout_RDX_01;
            }
          }
          else {
            info_00 = (string *)
                      ((long)&((local_a0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_1e0);
            name1._M_str = (char *)uVar4;
            name1._M_len = uVar5;
            name2._M_str = (char *)uVar6;
            name2._M_len = uVar7;
            bVar9 = anon_unknown_7::IsConflictingOneWay(field1,name1,pFVar14,name2,info_00);
            if ((bVar9) ||
               (name1_00._M_str = (char *)uVar6, name1_00._M_len = uVar7,
               name2_00._M_str = (char *)uVar4, name2_00._M_len = uVar5,
               bVar9 = anon_unknown_7::IsConflictingOneWay(pFVar14,name1_00,field1,name2_00,info_00)
               , pFVar13 = extraout_RDX_02, bVar9)) {
              local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6 & 0x3ffffff] =
                   local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [uVar15 >> 6 & 0x3ffffff] | 1L << ((byte)uVar15 & 0x3f);
              local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar16] =
                   local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16] |
                   local_190;
              std::__cxx11::string::_M_assign
                        ((string *)
                         (local_a0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_198));
              pFVar13 = extraout_RDX_03;
            }
          }
          if ((FieldDescriptor *)local_180._0_8_ != (FieldDescriptor *)(local_180 + 0x10)) {
            operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
            pFVar13 = extraout_RDX_04;
          }
          uVar15 = uVar15 + 1;
          ppFVar11 = (local_188->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          local_1e0 = local_1e0 + 0x20;
        } while (uVar15 < (ulong)((long)(local_188->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11
                                 >> 3));
      }
      uVar15 = local_80;
      fields = local_188;
      if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar16] & local_190) != 0) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)&local_160,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/context.cc"
                   ,0xa3);
        str._M_str = "field \"";
        str._M_len = 7;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_160,str);
        pcVar3 = (field1->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar3 + 2);
        v._M_str = pcVar3 + ~v._M_len;
        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&local_160,v);
        str_00._M_str = "\" is conflicting ";
        str_00._M_len = 0x11;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str_00);
        str_01._M_str = "with another field: ";
        str_01._M_len = 0x14;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str_01);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (this_00,local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)local_198);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_160);
      }
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      ppFVar12 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppFVar11 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      pFVar13 = (FieldDescriptor *)((long)ppFVar11 - (long)ppFVar12 >> 3);
      uVar15 = uVar15 + 1;
      local_a8 = local_a8 + 0x20;
      pFVar14 = local_88;
    } while (local_88 < pFVar13);
  }
  pCVar8 = local_b0;
  if (ppFVar11 != ppFVar12) {
    pFVar13 = (FieldDescriptor *)&(local_b0->options_).output_list_file;
    this_01 = &local_b0->field_generator_info_map_;
    uVar15 = 0;
    do {
      local_f8 = &local_e8;
      local_120.default_value_enum_ = (EnumValueDescriptor *)&local_110;
      local_180._0_8_ = ppFVar12[uVar15];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      local_160._M_string_length = 0;
      local_160.field_2._M_allocated_capacity =
           local_160.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_138 = (char *)0x0;
      local_130 = (FeatureSet *)((ulong)local_130 & 0xffffffffffffff00);
      local_118 = (char *)0x0;
      local_110 = 0;
      local_100 = 0;
      local_fc = 1;
      local_f0 = 0;
      local_e8 = 0;
      local_d8 = &local_c8;
      local_d0 = 0;
      local_c8 = 0;
      local_b8 = 0x100;
      local_140.message_type = (Descriptor *)&local_130;
      CamelCaseFieldName_abi_cxx11_((string *)local_1c8,(java *)local_180._0_8_,pFVar13);
      std::__cxx11::string::operator=((string *)&local_160,(string *)local_1c8);
      pFVar13 = extraout_RDX_05;
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        pFVar13 = extraout_RDX_06;
      }
      CapitalizedFieldName_abi_cxx11_((string *)local_1c8,(java *)local_180._0_8_,pFVar13);
      std::__cxx11::string::operator=((string *)&local_140,(string *)local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6 & 0x3ffffff] >> (uVar15 & 0x3f) & 1)
          != 0) {
        buffer.slot_ = (slot_type *)(local_1c8 + 0x10);
        local_1c8._0_8_ =
             absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(int *)(local_180._0_8_ + 4),(Nonnull<char_*>)buffer.slot_);
        local_1c8._0_8_ = local_1c8._0_8_ + -(long)buffer.slot_;
        local_1c8._8_8_ = buffer.slot_;
        absl::lts_20250127::StrAppend(&local_160,(AlphaNum *)local_1c8);
        local_1c8._0_8_ =
             absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(int *)(local_180._0_8_ + 4),(Nonnull<char_*>)buffer.slot_);
        local_1c8._0_8_ = local_1c8._0_8_ + -(long)buffer.slot_;
        local_1c8._8_8_ = buffer.slot_;
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)&local_140,(AlphaNum *)local_1c8);
        std::__cxx11::string::_M_assign((string *)&local_120.default_generated_instance_);
      }
      local_fc._0_1_ = (pCVar8->options_).opensource_runtime;
      local_fc._1_1_ = (pCVar8->options_).annotate_code;
      local_100._0_1_ = (pCVar8->options_).generate_immutable_code;
      local_100._1_1_ = (pCVar8->options_).generate_mutable_code;
      local_100._2_1_ = (pCVar8->options_).generate_shared_code;
      local_100._3_1_ = (pCVar8->options_).enforce_lite;
      std::__cxx11::string::_M_assign((string *)&local_f8);
      std::__cxx11::string::_M_assign((string *)&local_d8);
      local_b8._0_1_ = (local_b0->options_).strip_nonfunctional_codegen;
      local_b8._1_1_ = (local_b0->options_).jvm_dsl;
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
      ::try_emplace_impl<google::protobuf::FieldDescriptor_const*const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>::iterator,_bool>
                  *)local_1c8,this_01,(FieldDescriptor **)local_180);
      uVar4 = local_1c8._8_8_;
      std::__cxx11::string::_M_assign((string *)(local_1c8._8_8_ + 8));
      std::__cxx11::string::_M_assign((string *)(uVar4 + 0x28));
      std::__cxx11::string::_M_assign((string *)(uVar4 + 0x48));
      *(undefined2 *)(uVar4 + 0x6c) = local_fc;
      *(undefined4 *)(uVar4 + 0x68) = local_100;
      std::__cxx11::string::_M_assign((string *)(uVar4 + 0x70));
      std::__cxx11::string::_M_assign((string *)(uVar4 + 0x90));
      *(undefined2 *)(uVar4 + 0xb0) = local_b8;
      pFVar13 = extraout_RDX_07;
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
        pFVar13 = extraout_RDX_08;
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
        pFVar13 = extraout_RDX_09;
      }
      if (local_120 != &local_110) {
        operator_delete(local_120.default_value_enum_,CONCAT71(uStack_10f,local_110) + 1);
        pFVar13 = extraout_RDX_10;
      }
      if (local_140.message_type != (Descriptor *)&local_130) {
        operator_delete(local_140.message_type,
                        (ulong)((long)&(local_130->super_Message).super_MessageLite.
                                       _vptr_MessageLite + 1));
        pFVar13 = extraout_RDX_11;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        pFVar13 = extraout_RDX_12;
      }
      uVar15 = uVar15 + 1;
      ppFVar12 = (local_188->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(local_188->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar12 >>
                             3));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = CapitalizedFieldName(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = CapitalizedFieldName(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            absl::StrCat("capitalized name of field \"", field->name(),
                         "\" conflicts with field \"", other->name(), "\"");
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      ABSL_LOG(WARNING) << "field \"" << field->full_name()
                        << "\" is conflicting "
                        << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = CapitalizedFieldName(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      absl::StrAppend(&info.name, field->number());
      absl::StrAppend(&info.capitalized_name, field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    info.options = options_;
    field_generator_info_map_[field] = info;
  }
}